

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlParser.cpp
# Opt level: O0

void __thiscall KDReports::Test::wrongTopElement(Test *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  QString local_d0;
  QString local_b8;
  QString local_a0;
  QString local_88;
  ErrorDetails local_70 [8];
  ErrorDetails details;
  Report report;
  QFlags<QIODeviceBase::OpenModeFlag> local_48 [4];
  QString local_38;
  QFile local_20 [8];
  QFile file;
  Test *this_local;
  
  QString::QString(&local_38,":/wrongTopElement.xml");
  QFile::QFile(local_20,(QString *)&local_38);
  QString::~QString(&local_38);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags(local_48,ReadOnly);
  bVar1 = QFile::open((QFlags_conflict *)local_20);
  bVar1 = QTest::qVerify((bool)(bVar1 & 1),"file.open(QIODevice::ReadOnly)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0xd7);
  if ((bVar1 & 1) != 0) {
    KDReports::Report::Report((Report *)&details,(QObject *)0x0);
    KDReports::ErrorDetails::ErrorDetails(local_70);
    bVar1 = KDReports::Report::loadFromXML((QIODevice *)&details,(ErrorDetails *)local_20);
    bVar1 = QTest::qVerify((bool)(~bVar1 & 1),"!report.loadFromXML(&file, &details)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0xda);
    if ((bVar1 & 1) != 0) {
      iVar3 = KDReports::ErrorDetails::line();
      bVar1 = QTest::qCompare(iVar3,-1,"details.line()","-1",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                              ,0xdb);
      if ((bVar1 & 1) != 0) {
        iVar3 = KDReports::ErrorDetails::column();
        bVar1 = QTest::qCompare(iVar3,-1,"details.column()","-1",
                                "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                ,0xdc);
        if ((bVar1 & 1) != 0) {
          KDReports::ErrorDetails::driverMessage();
          QString::QString(&local_a0,
                           "Expected \"<report>\" as the topmost element, but found \"<XreportX>\"")
          ;
          bVar2 = QTest::qCompare(&local_88,&local_a0,"details.driverMessage()",
                                  "QString(\"Expected \\\"<report>\\\" as the topmost element, but found \\\"<XreportX>\\\"\")"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                  ,0xdd);
          QString::~QString(&local_a0);
          QString::~QString(&local_88);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            KDReports::ErrorDetails::message();
            QString::QString(&local_d0,
                             "Expected \"<report>\" as the topmost element, but found \"<XreportX>\""
                            );
            QTest::qCompare(&local_b8,&local_d0,"details.message()",
                            "QString(\"Expected \\\"<report>\\\" as the topmost element, but found \\\"<XreportX>\\\"\")"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                            ,0xde);
            QString::~QString(&local_d0);
            QString::~QString(&local_b8);
          }
        }
      }
    }
    KDReports::ErrorDetails::~ErrorDetails(local_70);
    KDReports::Report::~Report((Report *)&details);
  }
  QFile::~QFile(local_20);
  return;
}

Assistant:

void wrongTopElement()
    {
        QFile file(":/wrongTopElement.xml");
        QVERIFY(file.open(QIODevice::ReadOnly));
        Report report;
        KDReports::ErrorDetails details;
        QVERIFY(!report.loadFromXML(&file, &details));
        QCOMPARE(details.line(), -1);
        QCOMPARE(details.column(), -1);
        QCOMPARE(details.driverMessage(), QString("Expected \"<report>\" as the topmost element, but found \"<XreportX>\""));
        QCOMPARE(details.message(), QString("Expected \"<report>\" as the topmost element, but found \"<XreportX>\""));
    }